

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8_t * __thiscall google::protobuf::io::EpsCopyOutputStream::Next(EpsCopyOutputStream *this)

{
  uint8_t *puVar1;
  int iVar2;
  ulong uVar3;
  uint8_t *puVar4;
  undefined8 uVar5;
  char *pcVar6;
  undefined8 uStack_40;
  int size;
  void *data;
  
  if (this->had_error_ == true) {
    pcVar6 = "!had_error_";
    uStack_40 = 0xb;
    uVar5 = 0x34c;
LAB_0027a09f:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&data,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
               ,uVar5,uStack_40,pcVar6);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&data);
  }
  if (this->stream_ == (ZeroCopyOutputStream *)0x0) {
    this->had_error_ = true;
  }
  else {
    puVar1 = this->end_;
    puVar4 = this->buffer_;
    if (this->buffer_end_ != (uint8_t *)0x0) {
      memcpy(this->buffer_end_,puVar4,(long)puVar1 - (long)puVar4);
      do {
        iVar2 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])(this->stream_,&data,&size);
        if ((char)iVar2 == '\0') {
          this->had_error_ = true;
          goto LAB_0027a065;
        }
        uVar3 = (ulong)(uint)size;
      } while (uVar3 == 0);
      if (0x10 < size) {
        uVar5 = *(undefined8 *)(this->end_ + 8);
        *(undefined8 *)data = *(undefined8 *)this->end_;
        *(undefined8 *)((long)data + 8) = uVar5;
        this->end_ = (uint8_t *)((long)data + (uVar3 - 0x10));
        this->buffer_end_ = (uint8_t *)0x0;
        return (uint8_t *)data;
      }
      if (size < 1) {
        pcVar6 = "size > 0";
        uStack_40 = 8;
        uVar5 = 0x362;
        goto LAB_0027a09f;
      }
      uVar5 = *(undefined8 *)(this->end_ + 8);
      *(undefined8 *)puVar4 = *(undefined8 *)this->end_;
      *(undefined8 *)(this->buffer_ + 8) = uVar5;
      this->buffer_end_ = (uint8_t *)data;
      puVar4 = puVar4 + uVar3;
      goto LAB_0027a069;
    }
    uVar5 = *(undefined8 *)(puVar1 + 8);
    *(undefined8 *)puVar4 = *(undefined8 *)puVar1;
    *(undefined8 *)(this->buffer_ + 8) = uVar5;
    this->buffer_end_ = puVar1;
  }
LAB_0027a065:
  puVar4 = this->buffer_ + 0x10;
LAB_0027a069:
  this->end_ = puVar4;
  return this->buffer_;
}

Assistant:

uint8_t* EpsCopyOutputStream::Next() {
  ABSL_DCHECK(!had_error_);  // NOLINT
  if (PROTOBUF_PREDICT_FALSE(stream_ == nullptr)) return Error();
  if (buffer_end_) {
    // We're in the patch buffer and need to fill up the previous buffer.
    std::memcpy(buffer_end_, buffer_, end_ - buffer_);
    uint8_t* ptr;
    int size;
    do {
      void* data;
      if (PROTOBUF_PREDICT_FALSE(!stream_->Next(&data, &size))) {
        // Stream has an error, we use the patch buffer to continue to be
        // able to write.
        return Error();
      }
      ptr = static_cast<uint8_t*>(data);
    } while (size == 0);
    if (PROTOBUF_PREDICT_TRUE(size > kSlopBytes)) {
      std::memcpy(ptr, end_, kSlopBytes);
      end_ = ptr + size - kSlopBytes;
      buffer_end_ = nullptr;
      return ptr;
    } else {
      ABSL_DCHECK(size > 0);  // NOLINT
      // Buffer to small
      std::memmove(buffer_, end_, kSlopBytes);
      buffer_end_ = ptr;
      end_ = buffer_ + size;
      return buffer_;
    }
  } else {
    std::memcpy(buffer_, end_, kSlopBytes);
    buffer_end_ = end_;
    end_ = buffer_ + kSlopBytes;
    return buffer_;
  }
}